

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void P_PredictPlayer(player_t *player)

{
  byte *pbVar1;
  ticcmd_t *ptVar2;
  ulong uVar3;
  double dVar4;
  APlayerPawn *pAVar5;
  msecnode_t *pmVar6;
  FBlockNode *pFVar7;
  FBlockNode *pFVar8;
  ticcmd_t *ptVar9;
  undefined2 uVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  int iVar17;
  bool bVar18;
  bool bVar19;
  AActor **ppAVar20;
  FBlockNode **ppFVar21;
  int iVar22;
  FBlockNode **ppFVar23;
  msecnode_t **ppmVar24;
  PredictPos *pPVar25;
  uint uVar26;
  msecnode_t *item;
  bool bVar27;
  bool bVar28;
  AActor *local_b8;
  PredictPos local_b0;
  PredictPos local_70;
  
  iVar17 = maketic;
  if ((((((!cl_noprediction.Value) && (!singletics)) && (!demoplayback)) &&
       ((player->mo != (APlayerPawn *)0x0 &&
        ((player_t *)(&players + (long)consoleplayer * 0x54) == player)))) &&
      ((player->playerstate == '\0' && ((netgame && ((player->cheats & 0x2000) == 0)))))) &&
     (gametic != maketic)) {
    player_t::operator=(&PredictionPlayerBackup,player);
    pAVar5 = player->mo;
    memcpy(PredictionActorBackup,&(pAVar5->super_AActor).snext,0x530);
    uVar3._0_4_ = (pAVar5->super_AActor).flags;
    uVar3._4_4_ = (pAVar5->super_AActor).flags2;
    (pAVar5->super_AActor).flags = (ActorFlags)(int)(uVar3 & 0xffbffffffffff7ff);
    (pAVar5->super_AActor).flags2 = (ActorFlags2)(int)((uVar3 & 0xffbffffffffff7ff) >> 0x20);
    pbVar1 = (byte *)((long)&player->cheats + 1);
    *pbVar1 = *pbVar1 | 0x20;
    item = (pAVar5->super_AActor).touching_sectorlist;
    TArray<msecnode_t_*,_msecnode_t_*>::Clear(&PredictionSector_sprev_Backup);
    TArray<sector_t_*,_sector_t_*>::Clear(&PredictionTouchingSectorsBackup);
    for (; item != (msecnode_t *)0x0; item = item->m_tnext) {
      TArray<sector_t_*,_sector_t_*>::Push(&PredictionTouchingSectorsBackup,&item->m_sector);
      ppmVar24 = &item->m_sector->touching_thinglist;
      while (pmVar6 = *ppmVar24, pmVar6 != (msecnode_t *)0x0) {
        if ((APlayerPawn *)pmVar6->m_thing == pAVar5) {
          TArray<msecnode_t_*,_msecnode_t_*>::Push(&PredictionSector_sprev_Backup,&pmVar6->m_sprev);
          break;
        }
        ppmVar24 = &pmVar6->m_snext;
      }
    }
    TArray<AActor_*,_AActor_*>::Clear(&PredictionSectorListBackup);
    if (((pAVar5->super_AActor).flags.Value & 8) == 0) {
      ppAVar20 = &((pAVar5->super_AActor).Sector)->thinglist;
      while (local_b8 = *ppAVar20, local_b8 != (AActor *)0x0) {
        TArray<AActor_*,_AActor_*>::Push(&PredictionSectorListBackup,&local_b8);
        ppAVar20 = &local_b8->snext;
      }
    }
    ppFVar23 = &(pAVar5->super_AActor).BlockNode;
    ppFVar21 = ppFVar23;
    while (pFVar7 = *ppFVar21, pFVar7 != (FBlockNode *)0x0) {
      ppFVar21 = pFVar7->PrevActor;
      pFVar8 = pFVar7->NextActor;
      if (pFVar8 != (FBlockNode *)0x0) {
        pFVar8->PrevActor = ppFVar21;
      }
      *ppFVar21 = pFVar8;
      ppFVar21 = &pFVar7->NextBlock;
    }
    *ppFVar23 = (FBlockNode *)0x0;
    bVar19 = 0.01 <= cl_predict_lerpscale.Value;
    bVar27 = ticdup == 1;
    bVar18 = R_GetViewInterpolationStatus();
    bVar28 = false;
    for (uVar26 = gametic; (int)uVar26 < iVar17; uVar26 = uVar26 + 1) {
      if (!bVar18) {
        R_RebuildViewInterpolation(player);
      }
      iVar22 = (int)uVar26 % 0xb4;
      uVar10 = *(undefined2 *)&localcmds[iVar22].field_0x12;
      (player->cmd).consistancy = localcmds[iVar22].consistancy;
      *(undefined2 *)&(player->cmd).field_0x12 = uVar10;
      ptVar2 = localcmds + iVar22;
      sVar11 = (ptVar2->ucmd).pitch;
      sVar12 = (ptVar2->ucmd).yaw;
      ptVar9 = localcmds + iVar22;
      sVar13 = (ptVar9->ucmd).roll;
      sVar14 = (ptVar9->ucmd).forwardmove;
      sVar15 = (ptVar9->ucmd).sidemove;
      sVar16 = (ptVar9->ucmd).upmove;
      (player->cmd).ucmd.buttons = (ptVar2->ucmd).buttons;
      (player->cmd).ucmd.pitch = sVar11;
      (player->cmd).ucmd.yaw = sVar12;
      (player->cmd).ucmd.roll = sVar13;
      (player->cmd).ucmd.forwardmove = sVar14;
      (player->cmd).ucmd.sidemove = sVar15;
      (player->cmd).ucmd.upmove = sVar16;
      P_PlayerThink(player);
      (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[7])();
      if ((uVar26 == PredictionLast.gametic && 0 < PredictionLast.gametic) &&
          (!bVar18 && (bVar27 && bVar19))) {
        pAVar5 = player->mo;
        dVar4 = (pAVar5->super_AActor).__Pos.X;
        bVar28 = true;
        if ((int)PredictionLast.pos.X == (int)dVar4) {
          bVar28 = (int)PredictionLast.pos.Y != (int)(pAVar5->super_AActor).__Pos.Y;
        }
        if ((2 < developer.Value) && (bVar28)) {
          DPrintf(3,"Lerp! Ltic (%d) && Ptic (%d) | Lx (%f) && Px (%f) | Ly (%f) && Py (%f)\n",
                  SUB84(PredictionLast.pos.X,0),dVar4,SUB84(PredictionLast.pos.Y,0),
                  (pAVar5->super_AActor).__Pos.Y,(ulong)uVar26,(ulong)uVar26);
          bVar28 = true;
        }
      }
    }
    if (bVar27 && bVar19) {
      if (bVar18) {
        PredictionLerpResult.gametic = 0;
        PredictionLerpFrom.gametic = 0;
        PredictionLerptics = 0;
      }
      else if (bVar28) {
        pPVar25 = &PredictionLerpResult;
        if (PredictionLerptics == 0) {
          pPVar25 = &PredictionLast;
        }
        PredictPos::operator=(&PredictionLerpFrom,pPVar25);
        PredictionLerptics = 1;
      }
      PredictionLast.gametic = iVar17 + -1;
      pAVar5 = player->mo;
      PredictionLast.pos.X = (pAVar5->super_AActor).__Pos.X;
      PredictionLast.pos.Y = (pAVar5->super_AActor).__Pos.Y;
      PredictionLast.pos.Z = (pAVar5->super_AActor).__Pos.Z;
      if (0 < PredictionLerptics) {
        if (0 < PredictionLerpFrom.gametic) {
          local_70.gametic = PredictionLerpFrom.gametic;
          local_70.pos.X = PredictionLerpFrom.pos.X;
          local_70.pos.Y = PredictionLerpFrom.pos.Y;
          local_70.pos.Z = PredictionLerpFrom.pos.Z;
          local_70.angles.Pitch.Degrees = PredictionLerpFrom.angles.Pitch.Degrees;
          local_70.angles.Yaw.Degrees = PredictionLerpFrom.angles.Yaw.Degrees;
          local_70.angles.Roll.Degrees = PredictionLerpFrom.angles.Roll.Degrees;
          local_b0.angles.Pitch.Degrees = PredictionLast.angles.Pitch.Degrees;
          local_b0.angles.Yaw.Degrees = PredictionLast.angles.Yaw.Degrees;
          local_b0.angles.Roll.Degrees = PredictionLast.angles.Roll.Degrees;
          local_b0.gametic = PredictionLast.gametic;
          local_b0.pos.X = PredictionLast.pos.X;
          local_b0.pos.Y = PredictionLast.pos.Y;
          local_b0.pos.Z = PredictionLast.pos.Z;
          bVar19 = P_LerpCalculate(&pAVar5->super_AActor,&local_70,&local_b0,&PredictionLerpResult,
                                   (float)PredictionLerptics * cl_predict_lerpscale.Value);
          if (bVar19) {
            PredictionLerptics = PredictionLerptics + 1;
            pAVar5 = player->mo;
            (pAVar5->super_AActor).__Pos.Z = PredictionLerpResult.pos.Z;
            dVar4 = PredictionLerpResult.pos.Y;
            (pAVar5->super_AActor).__Pos.X = PredictionLerpResult.pos.X;
            (pAVar5->super_AActor).__Pos.Y = dVar4;
            return;
          }
        }
        PredictionLerptics = 0;
      }
    }
  }
  return;
}

Assistant:

void P_PredictPlayer (player_t *player)
{
	int maxtic;

	if (cl_noprediction ||
		singletics ||
		demoplayback ||
		player->mo == NULL ||
		player != &players[consoleplayer] ||
		player->playerstate != PST_LIVE ||
		!netgame ||
		/*player->morphTics ||*/
		(player->cheats & CF_PREDICTING))
	{
		return;
	}

	maxtic = maketic;

	if (gametic == maxtic)
	{
		return;
	}

	// Save original values for restoration later
	PredictionPlayerBackup = *player;

	APlayerPawn *act = player->mo;
	memcpy(PredictionActorBackup, &act->snext, sizeof(APlayerPawn) - ((BYTE *)&act->snext - (BYTE *)act));

	act->flags &= ~MF_PICKUP;
	act->flags2 &= ~MF2_PUSHWALL;
	player->cheats |= CF_PREDICTING;

	// The ordering of the touching_sectorlist needs to remain unchanged
	// Also store a copy of all previous sector_thinglist nodes
	msecnode_t *mnode = act->touching_sectorlist;
	msecnode_t *snode;
	PredictionSector_sprev_Backup.Clear();
	PredictionTouchingSectorsBackup.Clear ();

	while (mnode != NULL)
	{
		PredictionTouchingSectorsBackup.Push (mnode->m_sector);

		for (snode = mnode->m_sector->touching_thinglist; snode; snode = snode->m_snext)
		{
			if (snode->m_thing == act)
			{
				PredictionSector_sprev_Backup.Push(snode->m_sprev);
				break;
			}
		}

		mnode = mnode->m_tnext;
	}

	// Keep an ordered list off all actors in the linked sector.
	PredictionSectorListBackup.Clear();
	if (!(act->flags & MF_NOSECTOR))
	{
		AActor *link = act->Sector->thinglist;
		
		while (link != NULL)
		{
			PredictionSectorListBackup.Push(link);
			link = link->snext;
		}
	}

	// Blockmap ordering also needs to stay the same, so unlink the block nodes
	// without releasing them. (They will be used again in P_UnpredictPlayer).
	FBlockNode *block = act->BlockNode;

	while (block != NULL)
	{
		if (block->NextActor != NULL)
		{
			block->NextActor->PrevActor = block->PrevActor;
		}
		*(block->PrevActor) = block->NextActor;
		block = block->NextBlock;
	}
	act->BlockNode = NULL;

	// Values too small to be usable for lerping can be considered "off".
	bool CanLerp = (!(cl_predict_lerpscale < 0.01f) && (ticdup == 1)), DoLerp = false, NoInterpolateOld = R_GetViewInterpolationStatus();
	for (int i = gametic; i < maxtic; ++i)
	{
		if (!NoInterpolateOld)
			R_RebuildViewInterpolation(player);

		player->cmd = localcmds[i % LOCALCMDTICS];
		P_PlayerThink (player);
		player->mo->Tick ();

		if (CanLerp && PredictionLast.gametic > 0 && i == PredictionLast.gametic && !NoInterpolateOld)
		{
			// Z is not compared as lifts will alter this with no apparent change
			// Make lerping less picky by only testing whole units
			DoLerp = (int)PredictionLast.pos.X != (int)player->mo->X() || (int)PredictionLast.pos.Y != (int)player->mo->Y();

			// Aditional Debug information
			if (developer >= DMSG_NOTIFY && DoLerp)
			{
				DPrintf(DMSG_NOTIFY, "Lerp! Ltic (%d) && Ptic (%d) | Lx (%f) && Px (%f) | Ly (%f) && Py (%f)\n",
					PredictionLast.gametic, i,
					(PredictionLast.pos.X), (player->mo->X()),
					(PredictionLast.pos.Y), (player->mo->Y()));
			}
		}
	}

	if (CanLerp)
	{
		if (NoInterpolateOld)
			P_PredictionLerpReset();

		else if (DoLerp)
		{
			// If lerping is already in effect, use the previous camera postion so the view doesn't suddenly snap
			PredictionLerpFrom = (PredictionLerptics == 0) ? PredictionLast : PredictionLerpResult;
			PredictionLerptics = 1;
		}

		PredictionLast.gametic = maxtic - 1;
		PredictionLast.pos = player->mo->Pos();
		//PredictionLast.portalgroup = player->mo->Sector->PortalGroup;

		if (PredictionLerptics > 0)
		{
			if (PredictionLerpFrom.gametic > 0 &&
				P_LerpCalculate(player->mo, PredictionLerpFrom, PredictionLast, PredictionLerpResult, (float)PredictionLerptics * cl_predict_lerpscale))
			{
				PredictionLerptics++;
				player->mo->SetXYZ(PredictionLerpResult.pos);
			}
			else
			{
				PredictionLerptics = 0;
			}
		}
	}
}